

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

undefined8 __thiscall
Catch::ReporterRegistrar<Catch::XmlReporter>::ReporterFactory::getDescription_abi_cxx11_
          (ReporterFactory *this)

{
  undefined8 in_RDI;
  
  XmlReporter::getDescription_abi_cxx11_();
  return in_RDI;
}

Assistant:

virtual std::string getDescription() const {
                return T::getDescription();
            }